

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonnetfmt.cpp
# Opt level: O2

void version(ostream *o)

{
  ostream *poVar1;
  char *pcVar2;
  
  poVar1 = std::operator<<(o,"Jsonnet reformatter ");
  pcVar2 = jsonnet_version();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void version(std::ostream &o)
{
    o << "Jsonnet reformatter " << jsonnet_version() << std::endl;
}